

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.h
# Opt level: O1

void __thiscall cfd::core::ScriptOperator::~ScriptOperator(ScriptOperator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_007f16e0;
  pcVar2 = (this->text_data_)._M_dataplus._M_p;
  paVar1 = &(this->text_data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~ScriptOperator() {
    // do nothing
  }